

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imtui-demo.cpp
# Opt level: O0

void ImTui::ShowAboutWindow(bool *p_open)

{
  bool bVar1;
  char *pcVar2;
  ImGuiIO *pIVar3;
  ImGuiStyle *pIVar4;
  float fVar5;
  bool copy_to_clipboard;
  ImGuiStyle *style;
  ImGuiIO *io;
  bool *in_stack_00000100;
  char *in_stack_00000108;
  ImGuiWindowFlags in_stack_000003d4;
  bool *in_stack_000003d8;
  char *in_stack_000003e0;
  ImVec2 *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  int auto_open_depth;
  char *local_38;
  float in_stack_ffffffffffffffd4;
  ImVec2 *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe4;
  uint id;
  
  bVar1 = ImGui::Begin(in_stack_000003e0,in_stack_000003d8,in_stack_000003d4);
  if (bVar1) {
    pcVar2 = ImGui::GetVersion();
    ImGui::Text("Dear ImGui %s",pcVar2);
    ImGui::Separator();
    ImGui::Text("By Omar Cornut and all Dear ImGui contributors.");
    ImGui::Text("Dear ImGui is licensed under the MIT License, see LICENSE for more information.");
    ImGui::Checkbox(in_stack_00000108,in_stack_00000100);
    if ((ShowAboutWindow::show_config_info & 1U) != 0) {
      pIVar3 = ImGui::GetIO();
      pIVar4 = ImGui::GetStyle();
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffdc,0.0,0.0);
      bVar1 = ImGui::Button(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      id = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffe4);
      ImGui::GetID(in_stack_ffffffffffffffc0);
      auto_open_depth = (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
      fVar5 = ImGui::GetTextLineHeightWithSpacing();
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffd4,0.0,fVar5 * 18.0);
      ImGui::BeginChildFrame
                (id,in_stack_ffffffffffffffd8,(ImGuiWindowFlags)in_stack_ffffffffffffffd4);
      if ((id & 0x1000000) != 0) {
        ImGui::LogToClipboard(auto_open_depth);
        ImGui::LogText("```\n");
      }
      ImGui::Text("Dear ImGui %s (%d)","1.81",0x46b4);
      ImGui::Separator();
      ImGui::Text("sizeof(size_t): %d, sizeof(ImDrawIdx): %d, sizeof(ImDrawVert): %d",8,2,0x14);
      ImGui::Text("define: __cplusplus=%d",0x3118f);
      ImGui::Text("define: __linux__");
      ImGui::Text("define: __GNUC__=%d",4);
      ImGui::Text("define: __clang_version__=%s",
                  "19.1.5 (https://github.com/swiftlang/llvm-project.git 188208b14562121ae1ac90190d00d823bcfbccff)"
                 );
      ImGui::Separator();
      if (pIVar3->BackendPlatformName == (char *)0x0) {
        local_38 = "NULL";
      }
      else {
        local_38 = pIVar3->BackendPlatformName;
      }
      ImGui::Text("io.BackendPlatformName: %s",local_38);
      if (pIVar3->BackendRendererName == (char *)0x0) {
        pcVar2 = "NULL";
      }
      else {
        pcVar2 = pIVar3->BackendRendererName;
      }
      ImGui::Text("io.BackendRendererName: %s",pcVar2);
      ImGui::Text("io.ConfigFlags: 0x%08X",(ulong)(uint)pIVar3->ConfigFlags);
      if ((pIVar3->ConfigFlags & 1U) != 0) {
        ImGui::Text(" NavEnableKeyboard");
      }
      if ((pIVar3->ConfigFlags & 2U) != 0) {
        ImGui::Text(" NavEnableGamepad");
      }
      if ((pIVar3->ConfigFlags & 4U) != 0) {
        ImGui::Text(" NavEnableSetMousePos");
      }
      if ((pIVar3->ConfigFlags & 8U) != 0) {
        ImGui::Text(" NavNoCaptureKeyboard");
      }
      if ((pIVar3->ConfigFlags & 0x10U) != 0) {
        ImGui::Text(" NoMouse");
      }
      if ((pIVar3->ConfigFlags & 0x20U) != 0) {
        ImGui::Text(" NoMouseCursorChange");
      }
      if ((pIVar3->MouseDrawCursor & 1U) != 0) {
        ImGui::Text("io.MouseDrawCursor");
      }
      if ((pIVar3->ConfigMacOSXBehaviors & 1U) != 0) {
        ImGui::Text("io.ConfigMacOSXBehaviors");
      }
      if ((pIVar3->ConfigInputTextCursorBlink & 1U) != 0) {
        ImGui::Text("io.ConfigInputTextCursorBlink");
      }
      if ((pIVar3->ConfigWindowsResizeFromEdges & 1U) != 0) {
        ImGui::Text("io.ConfigWindowsResizeFromEdges");
      }
      if ((pIVar3->ConfigWindowsMoveFromTitleBarOnly & 1U) != 0) {
        ImGui::Text("io.ConfigWindowsMoveFromTitleBarOnly");
      }
      if (0.0 <= pIVar3->ConfigMemoryCompactTimer) {
        ImGui::Text((char *)(double)pIVar3->ConfigMemoryCompactTimer,
                    "io.ConfigWindowsMemoryCompactTimer = %.1ff");
      }
      ImGui::Text("io.BackendFlags: 0x%08X",(ulong)(uint)pIVar3->BackendFlags);
      if ((pIVar3->BackendFlags & 1U) != 0) {
        ImGui::Text(" HasGamepad");
      }
      if ((pIVar3->BackendFlags & 2U) != 0) {
        ImGui::Text(" HasMouseCursors");
      }
      if ((pIVar3->BackendFlags & 4U) != 0) {
        ImGui::Text(" HasSetMousePos");
      }
      if ((pIVar3->BackendFlags & 8U) != 0) {
        ImGui::Text(" RendererHasVtxOffset");
      }
      ImGui::Separator();
      ImGui::Text("io.Fonts: %d fonts, Flags: 0x%08X, TexSize: %d,%d",
                  (ulong)(uint)(pIVar3->Fonts->Fonts).Size,(ulong)(uint)pIVar3->Fonts->Flags,
                  (ulong)(uint)pIVar3->Fonts->TexWidth,(ulong)(uint)pIVar3->Fonts->TexHeight);
      ImGui::Text((char *)(double)(pIVar3->DisplaySize).x,(double)(pIVar3->DisplaySize).y,
                  "io.DisplaySize: %.2f,%.2f");
      ImGui::Text((char *)(double)(pIVar3->DisplayFramebufferScale).x,
                  (double)(pIVar3->DisplayFramebufferScale).y,
                  "io.DisplayFramebufferScale: %.2f,%.2f");
      ImGui::Separator();
      ImGui::Text((char *)(double)(pIVar4->WindowPadding).x,(double)(pIVar4->WindowPadding).y,
                  "style.WindowPadding: %.2f,%.2f");
      ImGui::Text((char *)(double)pIVar4->WindowBorderSize,"style.WindowBorderSize: %.2f");
      ImGui::Text((char *)(double)(pIVar4->FramePadding).x,(double)(pIVar4->FramePadding).y,
                  "style.FramePadding: %.2f,%.2f");
      ImGui::Text((char *)(double)pIVar4->FrameRounding,"style.FrameRounding: %.2f");
      ImGui::Text((char *)(double)pIVar4->FrameBorderSize,"style.FrameBorderSize: %.2f");
      ImGui::Text((char *)(double)(pIVar4->ItemSpacing).x,(double)(pIVar4->ItemSpacing).y,
                  "style.ItemSpacing: %.2f,%.2f");
      ImGui::Text((char *)(double)(pIVar4->ItemInnerSpacing).x,(double)(pIVar4->ItemInnerSpacing).y,
                  "style.ItemInnerSpacing: %.2f,%.2f");
      if ((id & 0x1000000) != 0) {
        ImGui::LogText("\n```\n");
        ImGui::LogFinish();
      }
      ImGui::EndChildFrame();
    }
    ImGui::End();
  }
  else {
    ImGui::End();
  }
  return;
}

Assistant:

void ImTui::ShowAboutWindow(bool* p_open)
{
    if (!ImGui::Begin("About Dear ImGui", p_open, ImGuiWindowFlags_AlwaysAutoResize))
    {
        ImGui::End();
        return;
    }
    ImGui::Text("Dear ImGui %s", ImGui::GetVersion());
    ImGui::Separator();
    ImGui::Text("By Omar Cornut and all Dear ImGui contributors.");
    ImGui::Text("Dear ImGui is licensed under the MIT License, see LICENSE for more information.");

    static bool show_config_info = false;
    ImGui::Checkbox("Config/Build Information", &show_config_info);
    if (show_config_info)
    {
        ImGuiIO& io = ImGui::GetIO();
        ImGuiStyle& style = ImGui::GetStyle();

        bool copy_to_clipboard = ImGui::Button("Copy to clipboard");
        ImGui::BeginChildFrame(ImGui::GetID("cfginfos"), ImVec2(0, ImGui::GetTextLineHeightWithSpacing() * 18), ImGuiWindowFlags_NoMove);
        if (copy_to_clipboard)
        {
            ImGui::LogToClipboard();
            ImGui::LogText("```\n"); // Back quotes will make the text appears without formatting when pasting to GitHub
        }

        ImGui::Text("Dear ImGui %s (%d)", IMGUI_VERSION, IMGUI_VERSION_NUM);
        ImGui::Separator();
        ImGui::Text("sizeof(size_t): %d, sizeof(ImDrawIdx): %d, sizeof(ImDrawVert): %d", (int)sizeof(size_t), (int)sizeof(ImDrawIdx), (int)sizeof(ImDrawVert));
        ImGui::Text("define: __cplusplus=%d", (int)__cplusplus);
#ifdef IMGUI_DISABLE_OBSOLETE_FUNCTIONS
        ImGui::Text("define: IMGUI_DISABLE_OBSOLETE_FUNCTIONS");
#endif
#ifdef IMGUI_DISABLE_WIN32_DEFAULT_CLIPBOARD_FUNCTIONS
        ImGui::Text("define: IMGUI_DISABLE_WIN32_DEFAULT_CLIPBOARD_FUNCTIONS");
#endif
#ifdef IMGUI_DISABLE_WIN32_DEFAULT_IME_FUNCTIONS
        ImGui::Text("define: IMGUI_DISABLE_WIN32_DEFAULT_IME_FUNCTIONS");
#endif
#ifdef IMGUI_DISABLE_WIN32_FUNCTIONS
        ImGui::Text("define: IMGUI_DISABLE_WIN32_FUNCTIONS");
#endif
#ifdef IMGUI_DISABLE_DEFAULT_FORMAT_FUNCTIONS
        ImGui::Text("define: IMGUI_DISABLE_DEFAULT_FORMAT_FUNCTIONS");
#endif
#ifdef IMGUI_DISABLE_DEFAULT_MATH_FUNCTIONS
        ImGui::Text("define: IMGUI_DISABLE_DEFAULT_MATH_FUNCTIONS");
#endif
#ifdef IMGUI_DISABLE_DEFAULT_FILE_FUNCTIONS
        ImGui::Text("define: IMGUI_DISABLE_DEFAULT_FILE_FUNCTIONS");
#endif
#ifdef IMGUI_DISABLE_FILE_FUNCTIONS
        ImGui::Text("define: IMGUI_DISABLE_FILE_FUNCTIONS");
#endif
#ifdef IMGUI_DISABLE_DEFAULT_ALLOCATORS
        ImGui::Text("define: IMGUI_DISABLE_DEFAULT_ALLOCATORS");
#endif
#ifdef IMGUI_USE_BGRA_PACKED_COLOR
        ImGui::Text("define: IMGUI_USE_BGRA_PACKED_COLOR");
#endif
#ifdef _WIN32
        ImGui::Text("define: _WIN32");
#endif
#ifdef _WIN64
        ImGui::Text("define: _WIN64");
#endif
#ifdef __linux__
        ImGui::Text("define: __linux__");
#endif
#ifdef __APPLE__
        ImGui::Text("define: __APPLE__");
#endif
#ifdef _MSC_VER
        ImGui::Text("define: _MSC_VER=%d", _MSC_VER);
#endif
#ifdef __MINGW32__
        ImGui::Text("define: __MINGW32__");
#endif
#ifdef __MINGW64__
        ImGui::Text("define: __MINGW64__");
#endif
#ifdef __GNUC__
        ImGui::Text("define: __GNUC__=%d", (int)__GNUC__);
#endif
#ifdef __clang_version__
        ImGui::Text("define: __clang_version__=%s", __clang_version__);
#endif
        ImGui::Separator();
        ImGui::Text("io.BackendPlatformName: %s", io.BackendPlatformName ? io.BackendPlatformName : "NULL");
        ImGui::Text("io.BackendRendererName: %s", io.BackendRendererName ? io.BackendRendererName : "NULL");
        ImGui::Text("io.ConfigFlags: 0x%08X", io.ConfigFlags);
        if (io.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard)        ImGui::Text(" NavEnableKeyboard");
        if (io.ConfigFlags & ImGuiConfigFlags_NavEnableGamepad)         ImGui::Text(" NavEnableGamepad");
        if (io.ConfigFlags & ImGuiConfigFlags_NavEnableSetMousePos)     ImGui::Text(" NavEnableSetMousePos");
        if (io.ConfigFlags & ImGuiConfigFlags_NavNoCaptureKeyboard)     ImGui::Text(" NavNoCaptureKeyboard");
        if (io.ConfigFlags & ImGuiConfigFlags_NoMouse)                  ImGui::Text(" NoMouse");
        if (io.ConfigFlags & ImGuiConfigFlags_NoMouseCursorChange)      ImGui::Text(" NoMouseCursorChange");
        if (io.MouseDrawCursor)                                         ImGui::Text("io.MouseDrawCursor");
        if (io.ConfigMacOSXBehaviors)                                   ImGui::Text("io.ConfigMacOSXBehaviors");
        if (io.ConfigInputTextCursorBlink)                              ImGui::Text("io.ConfigInputTextCursorBlink");
        if (io.ConfigWindowsResizeFromEdges)                            ImGui::Text("io.ConfigWindowsResizeFromEdges");
        if (io.ConfigWindowsMoveFromTitleBarOnly)                       ImGui::Text("io.ConfigWindowsMoveFromTitleBarOnly");
        if (io.ConfigMemoryCompactTimer >= 0.0f)                        ImGui::Text("io.ConfigWindowsMemoryCompactTimer = %.1ff", io.ConfigMemoryCompactTimer);
        ImGui::Text("io.BackendFlags: 0x%08X", io.BackendFlags);
        if (io.BackendFlags & ImGuiBackendFlags_HasGamepad)             ImGui::Text(" HasGamepad");
        if (io.BackendFlags & ImGuiBackendFlags_HasMouseCursors)        ImGui::Text(" HasMouseCursors");
        if (io.BackendFlags & ImGuiBackendFlags_HasSetMousePos)         ImGui::Text(" HasSetMousePos");
        if (io.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)   ImGui::Text(" RendererHasVtxOffset");
        ImGui::Separator();
        ImGui::Text("io.Fonts: %d fonts, Flags: 0x%08X, TexSize: %d,%d", io.Fonts->Fonts.Size, io.Fonts->Flags, io.Fonts->TexWidth, io.Fonts->TexHeight);
        ImGui::Text("io.DisplaySize: %.2f,%.2f", io.DisplaySize.x, io.DisplaySize.y);
        ImGui::Text("io.DisplayFramebufferScale: %.2f,%.2f", io.DisplayFramebufferScale.x, io.DisplayFramebufferScale.y);
        ImGui::Separator();
        ImGui::Text("style.WindowPadding: %.2f,%.2f", style.WindowPadding.x, style.WindowPadding.y);
        ImGui::Text("style.WindowBorderSize: %.2f", style.WindowBorderSize);
        ImGui::Text("style.FramePadding: %.2f,%.2f", style.FramePadding.x, style.FramePadding.y);
        ImGui::Text("style.FrameRounding: %.2f", style.FrameRounding);
        ImGui::Text("style.FrameBorderSize: %.2f", style.FrameBorderSize);
        ImGui::Text("style.ItemSpacing: %.2f,%.2f", style.ItemSpacing.x, style.ItemSpacing.y);
        ImGui::Text("style.ItemInnerSpacing: %.2f,%.2f", style.ItemInnerSpacing.x, style.ItemInnerSpacing.y);

        if (copy_to_clipboard)
        {
            ImGui::LogText("\n```\n");
            ImGui::LogFinish();
        }
        ImGui::EndChildFrame();
    }
    ImGui::End();
}